

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

tuple<double,_long>
findBestCC<stSampleMulti<short,4>>
          (TWaveformViewT<stSampleMulti<short,_4>_> *waveform0,
          TWaveformViewT<stSampleMulti<short,_4>_> *waveform1,int64_t alignWindow)

{
  short sVar1;
  long lVar2;
  stSampleMulti<short,_4> *psVar3;
  long in_RCX;
  long lVar4;
  stSampleMulti<short,_4> *psVar5;
  stSampleMulti<short,_4> *psVar6;
  long lVar7;
  int64_t n;
  int64_t sum0;
  int64_t sum02;
  stSampleMulti<short,_4> *psVar8;
  _Head_base<0UL,_double,_false> _Var9;
  double dVar10;
  tuple<double,_long> tVar11;
  TWaveformViewT<TSampleMI16> local_40;
  
  lVar2 = waveform1->n;
  if (lVar2 < 1) {
    sum0 = 0;
    sum02 = 0;
  }
  else {
    psVar6 = waveform1->samples;
    lVar4 = 0;
    sum02 = 0;
    sum0 = 0;
    do {
      lVar7 = 0;
      do {
        sVar1 = (psVar6->super_array<short,_4UL>)._M_elems[lVar7];
        sum0 = sum0 + sVar1;
        sum02 = sum02 + (ulong)(uint)((int)sVar1 * (int)sVar1);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar4 = lVar4 + 1;
      psVar6 = psVar6 + 1;
    } while (lVar4 != lVar2);
  }
  if (in_RCX < 0) {
    _Var9._M_head_impl = -1.0;
    psVar6 = (stSampleMulti<short,_4> *)0xffffffffffffffff;
  }
  else {
    lVar4 = in_RCX * 2 + 1;
    psVar8 = (stSampleMulti<short,_4> *)-in_RCX;
    lVar7 = 1;
    if (1 < lVar4) {
      lVar7 = lVar4;
    }
    psVar5 = *(stSampleMulti<short,_4> **)alignWindow;
    psVar6 = (stSampleMulti<short,_4> *)0xffffffffffffffff;
    dVar10 = -1.0;
    do {
      local_40.samples = psVar5;
      local_40.n = lVar2;
      _Var9._M_head_impl = calcCC<stSampleMulti<short,4>>(waveform1,&local_40,sum0,sum02);
      psVar3 = psVar8;
      if (_Var9._M_head_impl <= dVar10) {
        _Var9._M_head_impl = dVar10;
        psVar3 = psVar6;
      }
      psVar6 = psVar3;
      psVar8 = (stSampleMulti<short,_4> *)((long)(psVar8->super_array<short,_4UL>)._M_elems + 1);
      psVar5 = psVar5 + 1;
      lVar7 = lVar7 + -1;
      dVar10 = _Var9._M_head_impl;
    } while (lVar7 != 0);
  }
  waveform0->samples = psVar6;
  waveform0->n = (int64_t)_Var9._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var9._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform0;
  return (tuple<double,_long>)tVar11.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TWaveformViewT<T> & waveform0,
    const TWaveformViewT<T> & waveform1,
    int64_t alignWindow) {
    TValueCC bestcc = -1.0;
    TOffset besto = -1;

    //auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;

#ifdef MY_DEBUG
    auto n1 = waveform1.n;
    if (n0 + 2*alignWindow != n1) {
        printf("BUG 924830jm92, n0 = %d, a = %d\n", (int) n0, (int) alignWindow);
    }
#endif

    auto ret = calcSum(waveform0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

    for (int o = 0; o <= 2*alignWindow; ++o) {
        auto cc = calcCC(waveform0, { samples1 + o, n0 }, sum0, sum02);
        if (cc > bestcc) {
            besto = o - alignWindow;
            bestcc = cc;
        }
    }

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}